

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::Rule>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,pointer pos,Rule *args)

{
  pointer pRVar1;
  ulong uVar2;
  pointer pRVar3;
  undefined8 *puVar4;
  Rule *pRVar5;
  long lVar6;
  ulong uVar7;
  Rule *pRVar8;
  Rule *pRVar9;
  pointer pRVar10;
  undefined8 *puVar11;
  pointer pRVar12;
  Rule *__cur;
  long lVar13;
  byte bVar14;
  
  bVar14 = 0;
  if (this->len == 0x1c71c71c71c71c7) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar2 = this->cap;
  if (uVar7 < uVar2 * 2) {
    uVar7 = uVar2 * 2;
  }
  if (0x1c71c71c71c71c7 - uVar2 < uVar2) {
    uVar7 = 0x1c71c71c71c71c7;
  }
  lVar13 = (long)pos - (long)this->data_;
  pRVar3 = (pointer)operator_new(uVar7 * 0x48);
  pRVar1 = (pointer)((long)pRVar3 + lVar13);
  pRVar10 = pRVar1;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pRVar10->ruleBlock).ptr = (args->ruleBlock).ptr;
    args = (Rule *)((long)args + (ulong)bVar14 * -0x10 + 8);
    pRVar10 = (pointer)((long)pRVar10 + (ulong)bVar14 * -0x10 + 8);
  }
  pRVar5 = this->data_;
  pRVar9 = pRVar5 + this->len;
  pRVar10 = pRVar3;
  if (pRVar9 == pos) {
    for (; lVar6 = 9, pRVar9 = pRVar5, pRVar12 = pRVar10, pRVar5 != pos; pRVar5 = pRVar5 + 1) {
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pRVar12->ruleBlock).ptr = (pRVar9->ruleBlock).ptr;
        pRVar9 = (Rule *)((long)pRVar9 + (ulong)bVar14 * -0x10 + 8);
        pRVar12 = (pointer)((long)pRVar12 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      args = pRVar9;
      pRVar10 = pRVar10 + 1;
    }
  }
  else {
    for (; lVar6 = 9, pRVar8 = pRVar5, pRVar12 = pRVar10, pRVar5 != pos; pRVar5 = pRVar5 + 1) {
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pRVar12->ruleBlock).ptr = (pRVar8->ruleBlock).ptr;
        pRVar8 = (Rule *)((long)pRVar8 + (ulong)bVar14 * -0x10 + 8);
        pRVar12 = (pointer)((long)pRVar12 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      pRVar10 = pRVar10 + 1;
      args = pRVar8;
    }
    puVar4 = (undefined8 *)(lVar13 + (long)pRVar3);
    for (; puVar4 = puVar4 + 9, lVar6 = 9, pRVar5 = pos, puVar11 = puVar4, pos != pRVar9;
        pos = pos + 1) {
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar11 = (pRVar5->ruleBlock).ptr;
        pRVar5 = (Rule *)((long)pRVar5 + (ulong)bVar14 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
      }
      args = pRVar5;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = uVar7;
  this->data_ = pRVar3;
  return pRVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}